

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

seed_t lest::seed(text *opt,text *arg)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  seed_t sVar4;
  runtime_error *this;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong *puVar8;
  bool bVar9;
  ulong *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong uStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90 [2];
  long local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)arg);
  if (iVar2 == 0) {
    sVar4 = time((time_t *)0x0);
    return sVar4;
  }
  pcVar1 = (arg->_M_dataplus)._M_p;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + arg->_M_string_length);
  local_e0 = 0x3736353433323130;
  local_e8 = 10;
  uStack_d8 = CONCAT53(uStack_d8._3_5_,0x3938);
  bVar9 = false;
  local_f0 = &local_e0;
  lVar3 = std::__cxx11::string::find_first_of((char *)local_90,(ulong)&local_e0,0);
  if (lVar3 != -1) {
    lVar3 = std::__cxx11::string::find_first_not_of((char *)local_90,(ulong)local_f0,0);
    bVar9 = lVar3 == -1;
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (bVar9) {
    pcVar1 = (arg->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + arg->_M_string_length);
    lVar3 = strtol((char *)local_50[0],(char **)0x0,10);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    return (long)(int)lVar3;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_d0,"expecting \'time\' or positive number with option \'",opt);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar5;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar7) {
    local_b0.field_2._M_allocated_capacity = *psVar7;
    local_b0.field_2._8_8_ = plVar5[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar7;
  }
  local_b0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::operator+(&local_70,&local_b0,arg);
  puVar6 = (ulong *)std::__cxx11::string::append((char *)&local_70);
  local_f0 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_f0 == puVar8) {
    local_e0 = *puVar8;
    uStack_d8 = puVar6[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar8;
  }
  local_e8 = puVar6[1];
  *puVar6 = (ulong)puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_f0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline seed_t seed( text opt, text arg )
{
    // std::time_t: implementation dependent

    if ( arg == "time" )
        return static_cast<seed_t>( time( lest_nullptr ) );

    if ( is_number( arg ) )
        return static_cast<seed_t>( lest::stoi( arg ) );

    throw std::runtime_error( "expecting 'time' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}